

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase706::run(TestCase706 *this)

{
  PathPtr fromPath;
  PathPtr toPath;
  char *pcVar1;
  size_t sVar2;
  ReadableFile *pRVar3;
  String *pSVar4;
  String *this_00;
  char cVar5;
  char *ptrCopy;
  bool bVar6;
  ArrayPtr<const_kj::StringPtr> parts;
  PathPtr path;
  StringPtr text;
  ArrayPtr<const_kj::StringPtr> parts_00;
  PathPtr path_00;
  StringPtr text_00;
  StringPtr name;
  StringPtr name_00;
  ArrayPtr<const_kj::StringPtr> parts_01;
  PathPtr path_01;
  ArrayPtr<const_kj::StringPtr> parts_02;
  PathPtr path_02;
  ArrayPtr<const_kj::StringPtr> parts_03;
  PathPtr path_03;
  ArrayPtr<const_kj::StringPtr> parts_04;
  PathPtr path_04;
  ArrayPtr<const_kj::StringPtr> parts_05;
  ArrayPtr<const_kj::StringPtr> parts_06;
  ArrayPtr<const_kj::StringPtr> parts_07;
  PathPtr path_05;
  Own<kj::Directory> src;
  Own<kj::Directory> dst;
  TestClock clock;
  String local_f8;
  FsNode local_d8;
  ReadableFile *local_d0;
  Path local_c8;
  undefined8 *local_a8;
  String *local_a0;
  undefined8 *local_98;
  String *local_90;
  Path local_88;
  undefined8 local_70;
  char *local_68;
  undefined8 local_60;
  TestClock local_50;
  String *local_40;
  size_t sStack_38;
  
  local_50.super_Clock._vptr_Clock = (_func_int **)&PTR_now_0043c488;
  local_50.time.value.value = (Quantity<long,_kj::_::NanosecondLabel>)1000000000;
  newInMemoryDirectory((kj *)&local_a8,&local_50.super_Clock);
  newInMemoryDirectory((kj *)&local_98,&local_50.super_Clock);
  pSVar4 = local_a0;
  local_88.parts.ptr = (String *)0x38b288;
  local_88.parts.size_ = 4;
  local_88.parts.disposer = (ArrayDisposer *)0x370438;
  local_70 = 4;
  parts.size_ = 2;
  parts.ptr = (StringPtr *)&local_88;
  Path::Path((Path *)&local_f8,parts);
  path.parts.size_ = (size_t)local_f8.content.ptr;
  path.parts.ptr = pSVar4;
  Directory::openFile((Directory *)&local_c8,path,(WriteMode)local_f8.content.size_);
  text.content.size_ = 7;
  text.content.ptr = "foobar";
  File::writeAll((File *)local_c8.parts.size_,text);
  sVar2 = local_c8.parts.size_;
  if ((File *)local_c8.parts.size_ != (File *)0x0) {
    local_c8.parts.size_ = 0;
    (**(code **)((local_c8.parts.ptr)->content).ptr)
              (local_c8.parts.ptr,
               (((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode[-2] +
               (long)&(((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode);
  }
  sVar2 = local_f8.content.size_;
  pcVar1 = local_f8.content.ptr;
  if ((String *)local_f8.content.ptr != (String *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  pSVar4 = local_a0;
  local_88.parts.ptr = (String *)0x38b288;
  local_88.parts.size_ = 4;
  local_88.parts.disposer = (ArrayDisposer *)0x3651a4;
  local_70 = 4;
  local_68 = "qux";
  local_60 = 4;
  parts_00.size_ = 3;
  parts_00.ptr = (StringPtr *)&local_88;
  Path::Path((Path *)&local_f8,parts_00);
  path_00.parts.size_ = (size_t)local_f8.content.ptr;
  path_00.parts.ptr = pSVar4;
  Directory::openFile((Directory *)&local_c8,path_00,(WriteMode)local_f8.content.size_);
  text_00.content.size_ = 7;
  text_00.content.ptr = "bazqux";
  File::writeAll((File *)local_c8.parts.size_,text_00);
  sVar2 = local_c8.parts.size_;
  if ((File *)local_c8.parts.size_ != (File *)0x0) {
    local_c8.parts.size_ = 0;
    (**(code **)((local_c8.parts.ptr)->content).ptr)
              (local_c8.parts.ptr,
               (((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode[-2] +
               (long)&(((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode);
  }
  sVar2 = local_f8.content.size_;
  pcVar1 = local_f8.content.ptr;
  if ((String *)local_f8.content.ptr != (String *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  TestClock::expectChanged(&local_50,(FsNode *)local_a0);
  TestClock::expectUnchanged(&local_50,(FsNode *)local_90);
  this_00 = local_90;
  name.content.size_ = 5;
  name.content.ptr = "link";
  Path::Path(&local_88,name);
  pSVar4 = local_a0;
  toPath.parts.size_ = local_88.parts.size_;
  toPath.parts.ptr = local_88.parts.ptr;
  name_00.content.size_ = 4;
  name_00.content.ptr = "foo";
  Path::Path((Path *)&local_f8,name_00);
  local_40 = (String *)local_f8.content.ptr;
  sStack_38 = local_f8.content.size_;
  fromPath.parts.size_ = local_f8.content.size_;
  fromPath.parts.ptr = (String *)local_f8.content.ptr;
  Directory::transfer((Directory *)this_00,toPath,CREATE,(Directory *)pSVar4,fromPath,COPY);
  sVar2 = local_f8.content.size_;
  pcVar1 = local_f8.content.ptr;
  if ((String *)local_f8.content.ptr != (String *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  sVar2 = local_88.parts.size_;
  pSVar4 = local_88.parts.ptr;
  if (local_88.parts.ptr != (String *)0x0) {
    local_88.parts.ptr = (String *)0x0;
    local_88.parts.size_ = 0;
    (**(local_88.parts.disposer)->_vptr_ArrayDisposer)
              (local_88.parts.disposer,pSVar4,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  TestClock::expectUnchanged(&local_50,(FsNode *)local_a0);
  TestClock::expectChanged(&local_50,(FsNode *)local_90);
  pSVar4 = local_a0;
  local_88.parts.ptr = (String *)0x38b288;
  local_88.parts.size_ = 4;
  local_88.parts.disposer = (ArrayDisposer *)0x370438;
  local_70 = 4;
  parts_01.size_ = 2;
  parts_01.ptr = (StringPtr *)&local_88;
  Path::Path(&local_c8,parts_01);
  path_01.parts.size_ = (size_t)local_c8.parts.ptr;
  path_01.parts.ptr = pSVar4;
  ReadableDirectory::openFile((ReadableDirectory *)&local_d8,path_01);
  ReadableFile::readAllText(&local_f8,local_d0);
  sVar2 = local_f8.content.size_;
  pcVar1 = local_f8.content.ptr;
  bVar6 = true;
  if (local_f8.content.size_ == 7) {
    bVar6 = *(short *)((long)&((Array<char> *)local_f8.content.ptr)->ptr + 4) != 0x7261 ||
            *(int *)&((Array<char> *)local_f8.content.ptr)->ptr != 0x626f6f66;
  }
  if ((String *)local_f8.content.ptr != (String *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  pRVar3 = local_d0;
  if (local_d0 != (ReadableFile *)0x0) {
    local_d0 = (ReadableFile *)0x0;
    (**(code **)*local_d8._vptr_FsNode)
              (local_d8._vptr_FsNode,
               (pRVar3->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar3->super_FsNode);
  }
  sVar2 = local_c8.parts.size_;
  pSVar4 = local_c8.parts.ptr;
  if (local_c8.parts.ptr != (String *)0x0) {
    local_c8.parts.ptr = (String *)0x0;
    local_c8.parts.size_ = 0;
    (**(local_c8.parts.disposer)->_vptr_ArrayDisposer)
              (local_c8.parts.disposer,pSVar4,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  if ((bool)(bVar6 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[80]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2d3,ERROR,
               "\"failed: expected \" \"src->openFile(Path({\\\"foo\\\", \\\"bar\\\"}))->readAllText() == \\\"foobar\\\"\""
               ,(char (*) [80])
                "failed: expected src->openFile(Path({\"foo\", \"bar\"}))->readAllText() == \"foobar\""
              );
  }
  pSVar4 = local_a0;
  local_88.parts.ptr = (String *)0x38b288;
  local_88.parts.size_ = 4;
  local_88.parts.disposer = (ArrayDisposer *)0x3651a4;
  local_70 = 4;
  local_68 = "qux";
  local_60 = 4;
  parts_02.size_ = 3;
  parts_02.ptr = (StringPtr *)&local_88;
  Path::Path(&local_c8,parts_02);
  path_02.parts.size_ = (size_t)local_c8.parts.ptr;
  path_02.parts.ptr = pSVar4;
  ReadableDirectory::openFile((ReadableDirectory *)&local_d8,path_02);
  ReadableFile::readAllText(&local_f8,local_d0);
  sVar2 = local_f8.content.size_;
  pcVar1 = local_f8.content.ptr;
  bVar6 = true;
  if (local_f8.content.size_ == 7) {
    bVar6 = *(short *)((long)&((Array<char> *)local_f8.content.ptr)->ptr + 4) != 0x7875 ||
            *(int *)&((Array<char> *)local_f8.content.ptr)->ptr != 0x717a6162;
  }
  if ((String *)local_f8.content.ptr != (String *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  pRVar3 = local_d0;
  if (local_d0 != (ReadableFile *)0x0) {
    local_d0 = (ReadableFile *)0x0;
    (**(code **)*local_d8._vptr_FsNode)
              (local_d8._vptr_FsNode,
               (pRVar3->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar3->super_FsNode);
  }
  sVar2 = local_c8.parts.size_;
  pSVar4 = local_c8.parts.ptr;
  if (local_c8.parts.ptr != (String *)0x0) {
    local_c8.parts.ptr = (String *)0x0;
    local_c8.parts.size_ = 0;
    (**(local_c8.parts.disposer)->_vptr_ArrayDisposer)
              (local_c8.parts.disposer,pSVar4,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  if ((bool)(bVar6 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[87]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2d4,ERROR,
               "\"failed: expected \" \"src->openFile(Path({\\\"foo\\\", \\\"baz\\\", \\\"qux\\\"}))->readAllText() == \\\"bazqux\\\"\""
               ,(char (*) [87])
                "failed: expected src->openFile(Path({\"foo\", \"baz\", \"qux\"}))->readAllText() == \"bazqux\""
              );
  }
  pSVar4 = local_90;
  local_88.parts.ptr = (String *)0x37d4a0;
  local_88.parts.size_ = 5;
  local_88.parts.disposer = (ArrayDisposer *)0x370438;
  local_70 = 4;
  parts_03.size_ = 2;
  parts_03.ptr = (StringPtr *)&local_88;
  Path::Path(&local_c8,parts_03);
  path_03.parts.size_ = (size_t)local_c8.parts.ptr;
  path_03.parts.ptr = pSVar4;
  ReadableDirectory::openFile((ReadableDirectory *)&local_d8,path_03);
  ReadableFile::readAllText(&local_f8,local_d0);
  sVar2 = local_f8.content.size_;
  pcVar1 = local_f8.content.ptr;
  bVar6 = true;
  if (local_f8.content.size_ == 7) {
    bVar6 = *(short *)((long)&((Array<char> *)local_f8.content.ptr)->ptr + 4) != 0x7261 ||
            *(int *)&((Array<char> *)local_f8.content.ptr)->ptr != 0x626f6f66;
  }
  if ((String *)local_f8.content.ptr != (String *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  pRVar3 = local_d0;
  if (local_d0 != (ReadableFile *)0x0) {
    local_d0 = (ReadableFile *)0x0;
    (**(code **)*local_d8._vptr_FsNode)
              (local_d8._vptr_FsNode,
               (pRVar3->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar3->super_FsNode);
  }
  sVar2 = local_c8.parts.size_;
  pSVar4 = local_c8.parts.ptr;
  if (local_c8.parts.ptr != (String *)0x0) {
    local_c8.parts.ptr = (String *)0x0;
    local_c8.parts.size_ = 0;
    (**(local_c8.parts.disposer)->_vptr_ArrayDisposer)
              (local_c8.parts.disposer,pSVar4,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  if ((bool)(bVar6 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[81]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2d5,ERROR,
               "\"failed: expected \" \"dst->openFile(Path({\\\"link\\\", \\\"bar\\\"}))->readAllText() == \\\"foobar\\\"\""
               ,(char (*) [81])
                "failed: expected dst->openFile(Path({\"link\", \"bar\"}))->readAllText() == \"foobar\""
              );
  }
  pSVar4 = local_90;
  local_88.parts.ptr = (String *)0x37d4a0;
  local_88.parts.size_ = 5;
  local_88.parts.disposer = (ArrayDisposer *)0x3651a4;
  local_70 = 4;
  local_68 = "qux";
  local_60 = 4;
  parts_04.size_ = 3;
  parts_04.ptr = (StringPtr *)&local_88;
  Path::Path(&local_c8,parts_04);
  path_04.parts.size_ = (size_t)local_c8.parts.ptr;
  path_04.parts.ptr = pSVar4;
  ReadableDirectory::openFile((ReadableDirectory *)&local_d8,path_04);
  ReadableFile::readAllText(&local_f8,local_d0);
  sVar2 = local_f8.content.size_;
  pcVar1 = local_f8.content.ptr;
  bVar6 = true;
  if (local_f8.content.size_ == 7) {
    bVar6 = *(short *)((long)&((Array<char> *)local_f8.content.ptr)->ptr + 4) != 0x7875 ||
            *(int *)&((Array<char> *)local_f8.content.ptr)->ptr != 0x717a6162;
  }
  if ((String *)local_f8.content.ptr != (String *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  pRVar3 = local_d0;
  if (local_d0 != (ReadableFile *)0x0) {
    local_d0 = (ReadableFile *)0x0;
    (**(code **)*local_d8._vptr_FsNode)
              (local_d8._vptr_FsNode,
               (pRVar3->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar3->super_FsNode);
  }
  sVar2 = local_c8.parts.size_;
  pSVar4 = local_c8.parts.ptr;
  if (local_c8.parts.ptr != (String *)0x0) {
    local_c8.parts.ptr = (String *)0x0;
    local_c8.parts.size_ = 0;
    (**(local_c8.parts.disposer)->_vptr_ArrayDisposer)
              (local_c8.parts.disposer,pSVar4,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  if ((bool)(bVar6 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[88]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2d6,ERROR,
               "\"failed: expected \" \"dst->openFile(Path({\\\"link\\\", \\\"baz\\\", \\\"qux\\\"}))->readAllText() == \\\"bazqux\\\"\""
               ,(char (*) [88])
                "failed: expected dst->openFile(Path({\"link\", \"baz\", \"qux\"}))->readAllText() == \"bazqux\""
              );
  }
  pSVar4 = local_90;
  local_88.parts.ptr = (String *)0x37d4a0;
  local_88.parts.size_ = 5;
  local_88.parts.disposer = (ArrayDisposer *)0x370438;
  local_70 = 4;
  parts_05.size_ = 2;
  parts_05.ptr = (StringPtr *)&local_88;
  Path::Path((Path *)&local_f8,parts_05);
  cVar5 = (**(code **)((pSVar4->content).ptr + 0x40))
                    (pSVar4,local_f8.content.ptr,local_f8.content.size_);
  sVar2 = local_f8.content.size_;
  pcVar1 = local_f8.content.ptr;
  if ((String *)local_f8.content.ptr != (String *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  if (cVar5 == '\0' && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[52]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2d8,ERROR,
               "\"failed: expected \" \"dst->exists(Path({\\\"link\\\", \\\"bar\\\"}))\"",
               (char (*) [52])"failed: expected dst->exists(Path({\"link\", \"bar\"}))");
  }
  pSVar4 = local_a0;
  local_88.parts.ptr = (String *)0x38b288;
  local_88.parts.size_ = 4;
  local_88.parts.disposer = (ArrayDisposer *)0x370438;
  local_70 = 4;
  parts_06.size_ = 2;
  parts_06.ptr = (StringPtr *)&local_88;
  Path::Path((Path *)&local_f8,parts_06);
  Directory::remove((Directory *)pSVar4,local_f8.content.ptr);
  sVar2 = local_f8.content.size_;
  pcVar1 = local_f8.content.ptr;
  if ((String *)local_f8.content.ptr != (String *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  pSVar4 = local_90;
  local_88.parts.ptr = (String *)0x37d4a0;
  local_88.parts.size_ = 5;
  local_88.parts.disposer = (ArrayDisposer *)0x370438;
  local_70 = 4;
  parts_07.size_ = 2;
  parts_07.ptr = (StringPtr *)&local_88;
  Path::Path(&local_c8,parts_07);
  path_05.parts.size_ = (size_t)local_c8.parts.ptr;
  path_05.parts.ptr = pSVar4;
  ReadableDirectory::openFile((ReadableDirectory *)&local_d8,path_05);
  ReadableFile::readAllText(&local_f8,local_d0);
  sVar2 = local_f8.content.size_;
  pcVar1 = local_f8.content.ptr;
  bVar6 = true;
  if (local_f8.content.size_ == 7) {
    bVar6 = *(short *)((long)&((Array<char> *)local_f8.content.ptr)->ptr + 4) != 0x7261 ||
            *(int *)&((Array<char> *)local_f8.content.ptr)->ptr != 0x626f6f66;
  }
  if ((String *)local_f8.content.ptr != (String *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  pRVar3 = local_d0;
  if (local_d0 != (ReadableFile *)0x0) {
    local_d0 = (ReadableFile *)0x0;
    (**(code **)*local_d8._vptr_FsNode)
              (local_d8._vptr_FsNode,
               (pRVar3->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar3->super_FsNode);
  }
  sVar2 = local_c8.parts.size_;
  pSVar4 = local_c8.parts.ptr;
  if (local_c8.parts.ptr != (String *)0x0) {
    local_c8.parts.ptr = (String *)0x0;
    local_c8.parts.size_ = 0;
    (**(local_c8.parts.disposer)->_vptr_ArrayDisposer)
              (local_c8.parts.disposer,pSVar4,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  if ((bool)(bVar6 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[81]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2da,ERROR,
               "\"failed: expected \" \"dst->openFile(Path({\\\"link\\\", \\\"bar\\\"}))->readAllText() == \\\"foobar\\\"\""
               ,(char (*) [81])
                "failed: expected dst->openFile(Path({\"link\", \"bar\"}))->readAllText() == \"foobar\""
              );
  }
  pSVar4 = local_90;
  if (local_90 != (String *)0x0) {
    local_90 = (String *)0x0;
    (**(code **)*local_98)
              (local_98,(long)&(pSVar4->content).ptr + *(long *)((pSVar4->content).ptr + -0x10));
  }
  pSVar4 = local_a0;
  if (local_a0 != (String *)0x0) {
    local_a0 = (String *)0x0;
    (**(code **)*local_a8)
              (local_a8,(long)&(pSVar4->content).ptr + *(long *)((pSVar4->content).ptr + -0x10));
  }
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }